

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void Rescale(CPpmd7 *p)

{
  CPpmd_Void_Ref *pCVar1;
  Byte BVar2;
  ushort uVar3;
  CPpmd_State_Ref CVar4;
  CPpmd_State *pCVar5;
  CPpmd7_Context *pCVar6;
  Byte *pBVar7;
  Byte BVar8;
  UInt16 UVar9;
  Byte BVar10;
  UInt16 UVar11;
  undefined1 uVar12;
  undefined2 uVar13;
  UInt32 n;
  Byte *pBVar14;
  uint uVar15;
  uint uVar16;
  CPpmd_State *pCVar17;
  uint uVar18;
  byte bVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  UInt16 UVar25;
  CPpmd_State *pCVar26;
  CPpmd_State *ptr;
  uint uVar27;
  bool bVar28;
  CPpmd_State tmp;
  
  pCVar5 = p->FoundState;
  ptr = (CPpmd_State *)(p->Base + p->MinContext->Stats);
  UVar25 = pCVar5->SuccessorHigh;
  BVar2 = pCVar5->Symbol;
  BVar10 = pCVar5->Freq;
  UVar11 = pCVar5->SuccessorLow;
  for (; pCVar5 != ptr; pCVar5 = pCVar5 + -1) {
    pCVar5->SuccessorHigh = pCVar5[-1].SuccessorHigh;
    BVar8 = pCVar5[-1].Freq;
    UVar9 = pCVar5[-1].SuccessorLow;
    pCVar5->Symbol = pCVar5[-1].Symbol;
    pCVar5->Freq = BVar8;
    pCVar5->SuccessorLow = UVar9;
  }
  pCVar5->SuccessorHigh = UVar25;
  pCVar5->Symbol = BVar2;
  pCVar5->Freq = BVar10;
  pCVar5->SuccessorLow = UVar11;
  pCVar6 = p->MinContext;
  uVar3 = pCVar6->SummFreq;
  bVar19 = pCVar5->Freq;
  bVar23 = bVar19 + 4;
  pCVar5->Freq = bVar23;
  bVar28 = p->OrderFall != 0;
  uVar18 = (uint)bVar23 + (uint)bVar28 >> 1;
  pCVar5->Freq = (Byte)uVar18;
  iVar20 = pCVar6->NumStats - 1;
  pBVar7 = &pCVar5->Freq;
  uVar27 = (uint)uVar3 - (uint)bVar19;
  do {
    uVar15 = uVar27;
    pBVar14 = pBVar7;
    pCVar17 = pCVar5;
    bVar19 = pCVar17[1].Freq;
    uVar24 = (uint)bVar19 + (uint)bVar28 >> 1;
    bVar23 = (byte)uVar24;
    pCVar17[1].Freq = bVar23;
    if (pCVar17->Freq < uVar24) {
      BVar2 = pCVar17[1].Symbol;
      UVar25 = pCVar17[1].SuccessorLow;
      UVar11 = pCVar17[1].SuccessorHigh;
      pCVar5 = pCVar17;
      do {
        pCVar26 = pCVar5;
        pCVar26[1].SuccessorHigh = pCVar26->SuccessorHigh;
        BVar10 = pCVar26->Freq;
        UVar9 = pCVar26->SuccessorLow;
        pCVar26[1].Symbol = pCVar26->Symbol;
        pCVar26[1].Freq = BVar10;
        pCVar26[1].SuccessorLow = UVar9;
        if (pCVar26 == ptr) break;
        pCVar5 = pCVar26 + -1;
      } while (pCVar26[-1].Freq < bVar23);
      pCVar26->Symbol = BVar2;
      pCVar26->Freq = bVar23;
      pCVar26->SuccessorLow = UVar25;
      pCVar26->SuccessorHigh = UVar11;
    }
    uVar27 = uVar15 - bVar19;
    uVar18 = uVar18 + uVar24;
    iVar20 = iVar20 + -1;
    pCVar5 = pCVar17 + 1;
    pBVar7 = pBVar14 + 6;
    if (iVar20 == 0) {
      if (pCVar17[1].Freq == '\0') {
        pCVar6 = p->MinContext;
        uVar16 = (uint)pCVar6->NumStats;
        uVar27 = uVar15 - bVar19;
        uVar24 = uVar16;
        do {
          uVar24 = uVar24 - 1;
          uVar27 = uVar27 + 1;
          BVar2 = *pBVar14;
          pBVar14 = pBVar14 + -6;
        } while (BVar2 == '\0');
        UVar25 = (UInt16)uVar24;
        pCVar6->NumStats = UVar25;
        if (UVar25 == 1) {
          BVar2 = ptr->Symbol;
          bVar19 = ptr->Freq;
          CVar4 = *(CPpmd_State_Ref *)&ptr->SuccessorLow;
          uVar24 = uVar27;
          do {
            bVar19 = bVar19 - (bVar19 >> 1);
            uVar27 = uVar24 >> 1;
            bVar28 = 3 < uVar24;
            uVar24 = uVar27;
          } while (bVar28);
          bVar23 = p->Units2Indx[(uVar16 + 1 >> 1) - 1];
          pCVar1 = p->FreeList + bVar23;
          uVar12 = *(undefined1 *)((long)pCVar1 + 1);
          uVar13 = *(undefined2 *)((long)pCVar1 + 2);
          ptr->Symbol = *(undefined1 *)pCVar1;
          ptr->Freq = uVar12;
          ptr->SuccessorLow = uVar13;
          p->FreeList[bVar23] = (int)ptr - *(int *)&p->Base;
          p->FoundState = (CPpmd_State *)&pCVar6->SummFreq;
          *(Byte *)&pCVar6->SummFreq = BVar2;
          *(byte *)((long)&pCVar6->SummFreq + 1) = bVar19;
          pCVar6->Stats = CVar4;
        }
        else {
          uVar15 = uVar16 + 1 >> 1;
          uVar24 = (uVar24 & 0xffff) + 1 >> 1;
          if (uVar15 != uVar24) {
            if (p->Units2Indx[uVar15 - 1] != p->Units2Indx[uVar24 - 1]) {
              uVar16 = (uint)p->Units2Indx[uVar24 - 1];
              uVar22 = (ulong)p->FreeList[uVar16];
              uVar15 = (uint)p->Units2Indx[uVar15 - 1];
              if (uVar22 == 0) {
                SplitBlock(p,ptr,uVar15,uVar16);
              }
              else {
                pBVar7 = p->Base;
                pCVar5 = (CPpmd_State *)(pBVar7 + uVar22);
                p->FreeList[uVar16] = *(CPpmd_Void_Ref *)(pBVar7 + uVar22);
                lVar21 = 0;
                do {
                  *(undefined4 *)(&pCVar5->Symbol + lVar21) = *(undefined4 *)(&ptr->Symbol + lVar21)
                  ;
                  *(undefined4 *)((long)&pCVar5->SuccessorHigh + lVar21) =
                       *(undefined4 *)((long)&ptr->SuccessorHigh + lVar21);
                  *(undefined4 *)((long)&pCVar5[1].SuccessorLow + lVar21) =
                       *(undefined4 *)((long)&ptr[1].SuccessorLow + lVar21);
                  lVar21 = lVar21 + 0xc;
                  uVar24 = uVar24 - 1;
                } while (uVar24 != 0);
                pCVar1 = p->FreeList + uVar15;
                uVar12 = *(undefined1 *)((long)pCVar1 + 1);
                uVar13 = *(undefined2 *)((long)pCVar1 + 2);
                ptr->Symbol = *(undefined1 *)pCVar1;
                ptr->Freq = uVar12;
                ptr->SuccessorLow = uVar13;
                p->FreeList[uVar15] = (int)ptr - (int)pBVar7;
                ptr = pCVar5;
              }
            }
            p->MinContext->Stats = (int)ptr - *(int *)&p->Base;
          }
        }
        if (UVar25 == 1) {
          return;
        }
      }
      pCVar6 = p->MinContext;
      pCVar6->SummFreq = ((short)uVar18 + (short)uVar27) - (short)(uVar27 >> 1);
      p->FoundState = (CPpmd_State *)(p->Base + pCVar6->Stats);
      return;
    }
  } while( true );
}

Assistant:

static void Rescale(CPpmd8 *p)
{
  unsigned i, adder, sumFreq, escFreq;
  CPpmd_State *stats = STATS(p->MinContext);
  CPpmd_State *s = p->FoundState;
  {
    CPpmd_State tmp = *s;
    for (; s != stats; s--)
      s[0] = s[-1];
    *s = tmp;
  }
  escFreq = p->MinContext->SummFreq - s->Freq;
  s->Freq += 4;
  adder = (p->OrderFall != 0
      #ifdef PPMD8_FREEZE_SUPPORT
      || p->RestoreMethod > PPMD8_RESTORE_METHOD_FREEZE
      #endif
      );
  s->Freq = (Byte)((s->Freq + adder) >> 1);
  sumFreq = s->Freq;
  
  i = p->MinContext->NumStats;
  do
  {
    escFreq -= (++s)->Freq;
    s->Freq = (Byte)((s->Freq + adder) >> 1);
    sumFreq += s->Freq;
    if (s[0].Freq > s[-1].Freq)
    {
      CPpmd_State *s1 = s;
      CPpmd_State tmp = *s1;
      do
        s1[0] = s1[-1];
      while (--s1 != stats && tmp.Freq > s1[-1].Freq);
      *s1 = tmp;
    }
  }
  while (--i);
  
  if (s->Freq == 0)
  {
    unsigned numStats = p->MinContext->NumStats;
    unsigned n0, n1;
    do { i++; } while ((--s)->Freq == 0);
    escFreq += i;
    p->MinContext->NumStats = (Byte)(p->MinContext->NumStats - i);
    if (p->MinContext->NumStats == 0)
    {
      CPpmd_State tmp = *stats;
      tmp.Freq = (Byte)((2 * tmp.Freq + escFreq - 1) / escFreq);
      if (tmp.Freq > MAX_FREQ / 3)
        tmp.Freq = MAX_FREQ / 3;
      InsertNode(p, stats, U2I((numStats + 2) >> 1));
      p->MinContext->Flags = (Byte)((p->MinContext->Flags & 0x10) + 0x08 * (tmp.Symbol >= 0x40));
      *(p->FoundState = ONE_STATE(p->MinContext)) = tmp;
      return;
    }
    n0 = (numStats + 2) >> 1;
    n1 = (p->MinContext->NumStats + 2) >> 1;
    if (n0 != n1)
      p->MinContext->Stats = STATS_REF(ShrinkUnits(p, stats, n0, n1));
    p->MinContext->Flags &= ~0x08;
    p->MinContext->Flags |= 0x08 * ((s = STATS(p->MinContext))->Symbol >= 0x40);
    i = p->MinContext->NumStats;
    do { p->MinContext->Flags |= 0x08*((++s)->Symbol >= 0x40); } while (--i);
  }
  p->MinContext->SummFreq = (UInt16)(sumFreq + escFreq - (escFreq >> 1));
  p->MinContext->Flags |= 0x4;
  p->FoundState = STATS(p->MinContext);
}